

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall doctest::String::operator=(String *this,String *other)

{
  bool bVar1;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  
  if (in_RDI != in_RSI) {
    bVar1 = isOnStack((String *)in_RDI);
    src = extraout_RDX;
    if ((!bVar1) && (*(void **)in_RDI != (void *)0x0)) {
      operator_delete__(*(void **)in_RDI);
      src = extraout_RDX_00;
    }
    copy((String *)in_RDI,in_RSI,src);
  }
  return (String *)in_RDI;
}

Assistant:

String& String::operator=(const String& other) {
    if(this != &other) {
        if(!isOnStack())
            delete[] data.ptr;

        copy(other);
    }

    return *this;
}